

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O3

int ED::LongestChain(Chain *chains,int root)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if ((root != -1) && (iVar3 = 0, chains[root].len != 0)) {
    iVar2 = 0;
    iVar1 = 0;
    if (chains[root].children[0] != -1) {
      iVar1 = LongestChain(chains,chains[root].children[0]);
    }
    if (chains[root].children[1] != -1) {
      iVar2 = LongestChain(chains,chains[root].children[1]);
    }
    iVar3 = iVar2;
    if (iVar2 < iVar1) {
      iVar3 = iVar1;
    }
    chains[root].children[iVar2 <= iVar1] = -1;
    iVar3 = iVar3 + chains[root].len;
  }
  return iVar3;
}

Assistant:

int ED::LongestChain(Chain *chains, int root) {
	if (root == -1 || chains[root].len == 0) return 0;

	int len0 = 0;
	if (chains[root].children[0] != -1) len0 = LongestChain(chains, chains[root].children[0]);

	int len1 = 0;
	if (chains[root].children[1] != -1) len1 = LongestChain(chains, chains[root].children[1]);

	int max = 0;

	if (len0 >= len1) {
		max = len0;
		chains[root].children[1] = -1;

	}
	else {
		max = len1;
		chains[root].children[0] = -1;
	} //end-else

	return chains[root].len + max;
}